

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

size_t __thiscall google::protobuf::internal::ExtensionSet::ByteSize(ExtensionSet *this)

{
  size_t local_18;
  size_t total_size;
  ExtensionSet *this_local;
  
  local_18 = 0;
  total_size = (size_t)this;
  ForEach<google::protobuf::internal::ExtensionSet::ByteSize()const::__0>
            (this,(anon_class_8_1_736c71da)&local_18);
  return local_18;
}

Assistant:

size_t ExtensionSet::ByteSize() const {
  size_t total_size = 0;
  ForEach([&total_size](int number, const Extension& ext) {
    total_size += ext.ByteSize(number);
  });
  return total_size;
}